

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean
HTS_Model_load(HTS_Model *model,HTS_File *pdf,HTS_File *tree,size_t vector_length,size_t num_windows
              ,HTS_Boolean is_msd)

{
  long in_RCX;
  long in_RSI;
  HTS_Model *in_RDI;
  long in_R8;
  undefined7 unaff_retaddr;
  HTS_File *in_stack_000003f0;
  HTS_Model *in_stack_000003f8;
  HTS_Boolean is_msd_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  HTS_Boolean HVar1;
  
  if ((((in_RDI == (HTS_Model *)0x0) || (in_RSI == 0)) || (in_RCX == 0)) || (in_R8 == 0)) {
    HVar1 = '\0';
  }
  else {
    HTS_Model_clear(in_RDI);
    is_msd_00 = (HTS_Boolean)((ulong)in_RSI >> 0x38);
    HVar1 = HTS_Model_load_tree(in_stack_000003f8,in_stack_000003f0);
    if (HVar1 == '\x01') {
      HVar1 = HTS_Model_load_pdf((HTS_Model *)num_windows,(HTS_File *)CONCAT17(is_msd,unaff_retaddr)
                                 ,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                 (size_t)in_RDI,is_msd_00);
      if (HVar1 == '\x01') {
        HVar1 = '\x01';
      }
      else {
        HTS_Model_clear(in_RDI);
        HVar1 = '\0';
      }
    }
    else {
      HTS_Model_clear(in_RDI);
      HVar1 = '\0';
    }
  }
  return HVar1;
}

Assistant:

static HTS_Boolean HTS_Model_load(HTS_Model * model, HTS_File * pdf, HTS_File * tree, size_t vector_length, size_t num_windows, HTS_Boolean is_msd)
{
   /* check */
   if (model == NULL || pdf == NULL || vector_length == 0 || num_windows == 0)
      return FALSE;

   /* reset */
   HTS_Model_clear(model);

   /* load tree */
   if (HTS_Model_load_tree(model, tree) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   /* load pdf */
   if (HTS_Model_load_pdf(model, pdf, vector_length, num_windows, is_msd) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   return TRUE;
}